

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall
RPCHelpMan::RPCHelpMan
          (RPCHelpMan *this,string name,string description,
          vector<RPCArg,_std::allocator<RPCArg>_> args,RPCResults results,RPCExamples examples)

{
  long lVar1;
  string description_00;
  vector<RPCArg,_std::allocator<RPCArg>_> args_00;
  RPCResults results_00;
  undefined8 *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff48 [16];
  pointer pRVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer in_stack_ffffffffffffff70;
  string in_stack_ffffffffffffff78;
  RPCMethodImpl in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff90,in_RDX);
  pRVar2 = (pointer)*in_RCX;
  pRVar3 = (pointer)in_RCX[1];
  pRVar4 = (pointer)in_RCX[2];
  *in_RCX = 0;
  in_RCX[1] = 0;
  in_RCX[2] = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff40,in_R8);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff70,in_R9);
  description_00.field_2 = in_stack_ffffffffffffff38;
  description_00._M_dataplus._M_p = (pointer)0x0;
  description_00._M_string_length = 0;
  args_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar2;
  args_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffff48._0_8_;
  args_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffff48._8_8_;
  results_00.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pRVar4;
  results_00.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pRVar3;
  results_00.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff70;
  RPCHelpMan(this,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffff10,&stack0xffffffffffffff18)),
             description_00,args_00,results_00,(RPCExamples)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff98);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff40);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan::RPCHelpMan(std::string name, std::string description, std::vector<RPCArg> args, RPCResults results, RPCExamples examples)
    : RPCHelpMan{std::move(name), std::move(description), std::move(args), std::move(results), std::move(examples), nullptr} {}